

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::APIErrors::checkGLError
          (APIErrors *this,GLenum expected_error,GLchar *description,bool *out_result)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  GLenum local_34;
  long lStack_30;
  GLenum error;
  Functions *gl;
  bool *out_result_local;
  GLchar *description_local;
  APIErrors *pAStack_10;
  GLenum expected_error_local;
  APIErrors *this_local;
  
  gl = (Functions *)out_result;
  out_result_local = (bool *)description;
  description_local._4_4_ = expected_error;
  pAStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = (**(code **)(lStack_30 + 0x800))();
  if (description_local._4_4_ != local_34) {
    this_00 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [30])"Test case fail. Description: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&out_result_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" Invalid error: ");
    EVar4 = glu::getErrorStr(local_34);
    local_1e8 = EVar4.m_getName;
    local_1e0 = EVar4.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b48384);
    EVar4 = glu::getErrorStr(description_local._4_4_);
    local_1f8.m_getName = EVar4.m_getName;
    local_1f8.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f8);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    *(undefined1 *)&gl->activeShaderProgram = 0;
  }
  return;
}

Assistant:

void APIErrors::checkGLError(GLenum expected_error, const GLchar* description, bool& out_result)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLenum error = gl.getError();

	if (expected_error != error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case fail. Description: " << description
											<< " Invalid error: " << glu::getErrorStr(error)
											<< " expected: " << glu::getErrorStr(expected_error)
											<< tcu::TestLog::EndMessage;

		out_result = false;
	}
}